

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void __thiscall capnp::_::ReadLimiter::unread(ReadLimiter *this,WordCount64 amount)

{
  uint64_t uVar1;
  unsigned_long uVar2;
  uint64_t newValue;
  uint64_t oldValue;
  WordCount64 amount_local;
  ReadLimiter *this_local;
  
  uVar1 = readLimit(this);
  uVar2 = unbound<unsigned_long>(amount);
  if (uVar1 < uVar1 + uVar2) {
    setLimit(this,uVar1 + uVar2);
  }
  return;
}

Assistant:

void ReadLimiter::unread(WordCount64 amount) {
  // Be careful not to overflow here.  Since ReadLimiter has no thread-safety, it's possible that
  // the limit value was not updated correctly for one or more reads, and therefore unread() could
  // overflow it even if it is only unreading bytes that were actually read.
  uint64_t oldValue = readLimit();
  uint64_t newValue = oldValue + unbound(amount / WORDS);
  if (newValue > oldValue) {
    setLimit(newValue);
  }
}